

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9Builtin_fgetc(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  io_private *pDev;
  jx9_int64 jVar1;
  int c;
  
  if ((((nArg < 1) || (((*apArg)->iFlags & 0x100) == 0)) ||
      (pDev = (io_private *)((*apArg)->x).pOther, pDev == (io_private *)0x0)) ||
     (pDev->iMagic != 0xfeac14)) {
    jx9_context_throw_error(pCtx,2,"Expecting an IO handle");
  }
  else if (pDev->pStream == (jx9_io_stream *)0x0) {
    jx9_context_throw_error_format
              (pCtx,2,
               "IO routine(%s) not implemented in the underlying stream(%s) device, JX9 is returning FALSE"
               ,(pCtx->pFunc->sName).zString,"null_stream");
  }
  else {
    jVar1 = StreamRead(pDev,&c,1);
    if (0 < (int)jVar1) {
      jx9_result_string(pCtx,(char *)&c,1);
      return 0;
    }
  }
  jx9_result_bool(pCtx,0);
  return 0;
}

Assistant:

static int jx9Builtin_fgetc(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const jx9_io_stream *pStream;
	io_private *pDev;
	int c, n;
	if( nArg < 1 || !jx9_value_is_resource(apArg[0]) ){
		/* Missing/Invalid arguments, return FALSE */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Expecting an IO handle");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract our private data */
	pDev = (io_private *)jx9_value_to_resource(apArg[0]);
	/* Make sure we are dealing with a valid io_private instance */
	if( IO_PRIVATE_INVALID(pDev) ){
		/*Expecting an IO handle */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Expecting an IO handle");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the target IO stream device */
	pStream = pDev->pStream;
	if( pStream == 0  ){
		jx9_context_throw_error_format(pCtx, JX9_CTX_WARNING, 
			"IO routine(%s) not implemented in the underlying stream(%s) device, JX9 is returning FALSE", 
			jx9_function_name(pCtx), pStream ? pStream->zName : "null_stream"
			);
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Perform the requested operation */
	n = (int)StreamRead(pDev, (void *)&c, sizeof(char));
	/* IO result */
	if( n < 1 ){
		/* EOF or error, return FALSE */
		jx9_result_bool(pCtx, 0);
	}else{
		/* Return the string holding the character */
		jx9_result_string(pCtx, (const char *)&c, sizeof(char));
	}
	return JX9_OK;	
}